

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::toNumber(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  byte c;
  bool bVar1;
  uint uVar2;
  uint index;
  uint uVar3;
  Cell CVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint local_54;
  int local_4c;
  
  requireDStackDepth(this,4,">NUMBER");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  index = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00,3);
  uVar7 = (ulong)uVar3;
  uVar3 = ForthStack<unsigned_int>::getTop(this_00,2);
  uVar6 = (ulong)uVar3;
  CVar4 = dataSpaceAtCell(this,this->VarOffsetNumericBase);
  local_54 = 0;
  if (uVar2 != 0) {
    local_4c = -0x37;
    local_54 = uVar2;
    do {
      uVar3 = (uint)uVar6;
      c = dataSpaceAt(this,index);
      bVar1 = isValidDigit(this,c);
      if (!bVar1) goto LAB_001130db;
      iVar5 = local_4c;
      if (c < 0x41) {
        iVar5 = -0x30;
      }
      if (0x60 < c) {
        iVar5 = -0x57;
      }
      index = index + 1;
      uVar7 = (uVar7 & 0xffffffff | uVar6 << 0x20) * (ulong)CVar4 + (ulong)(iVar5 + (uint)c);
      uVar6 = uVar7 >> 0x20;
      uVar3 = (uint)(uVar7 >> 0x20);
      local_54 = local_54 - 1;
    } while (local_54 != 0);
    local_54 = 0;
  }
LAB_001130db:
  ForthStack<unsigned_int>::setTop(this_00,3,(uint)uVar7);
  ForthStack<unsigned_int>::setTop(this_00,2,uVar3);
  ForthStack<unsigned_int>::setTop(this_00,1,index);
  ForthStack<unsigned_int>::setTop(this_00,0,local_54);
  return;
}

Assistant:

void toNumber(){
			REQUIRE_DSTACK_DEPTH(4, ">NUMBER");
			Cell u1 = dStack.getTop();
			Cell caddr1 = dStack.getTop(1);
			DCell ud1(dStack.getTop(3),dStack.getTop(2));
			DCell base( getNumericBase() );
			while (u1 > 0){
				Char ch = getDataChar(caddr1);

				size_t position{} ;
				if (isValidDigit(ch)){
					position = digitValue(ch);
				} else {
					break;
				}
				--u1; ++caddr1;
				ud1.data_.Dcells = ud1.data_.Dcells * base.data_.Dcells + position;
			}
			dStack.setTop(3, ud1.data_.Cells.lo);
			dStack.setTop(2, ud1.data_.Cells.hi);
			dStack.setTop(1, caddr1);
			dStack.setTop(0, u1);


		}